

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O2

int __thiscall anon_unknown.dwarf_265da4::SndioPlayback::mixerProc(SndioPlayback *this)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  pointer outBuffer;
  sio_par par;
  
  sio_initpar(&par);
  iVar1 = sio_getpar(this->mSndHandle,&par);
  if (iVar1 == 0) {
    ALCdevice::handleDisconnect((this->super_BackendBase).mDevice,"Failed to get device parameters")
    ;
    return 1;
  }
  SetRTPriority();
  althrd_setname("alsoft-mixer");
LAB_0015ec0c:
  do {
    if ((((this->mKillNow)._M_base._M_i & 1U) != 0) ||
       (((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & 1U) == 0)) {
      return 0;
    }
    outBuffer = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
                super__Vector_impl_data._M_start;
    uVar3 = (long)(this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)outBuffer;
    ALCdevice::renderSamples
              ((this->super_BackendBase).mDevice,outBuffer,
               (ALuint)((uVar3 & 0xffffffff) / ((ulong)par.bps * (ulong)par.pchan)),(ulong)par.pchan
              );
    while( true ) {
      if ((uVar3 == 0) || (((this->mKillNow)._M_base._M_i & 1U) != 0)) goto LAB_0015ec0c;
      lVar2 = sio_write(this->mSndHandle,outBuffer,uVar3);
      if (lVar2 == 0) break;
      uVar3 = uVar3 - lVar2;
      outBuffer = outBuffer + lVar2;
    }
    if (0 < (int)gLogLevel) {
      fwrite("[ALSOFT] (EE) sio_write failed\n",0x1f,1,(FILE *)gLogFile);
    }
    ALCdevice::handleDisconnect
              ((this->super_BackendBase).mDevice,"Failed to write playback samples");
  } while( true );
}

Assistant:

int SndioPlayback::mixerProc()
{
    sio_par par;
    sio_initpar(&par);
    if(!sio_getpar(mSndHandle, &par))
    {
        mDevice->handleDisconnect("Failed to get device parameters");
        return 1;
    }

    const size_t frameStep{par.pchan};
    const size_t frameSize{frameStep * par.bps};

    SetRTPriority();
    althrd_setname(MIXER_THREAD_NAME);

    while(!mKillNow.load(std::memory_order_acquire)
        && mDevice->Connected.load(std::memory_order_acquire))
    {
        al::byte *WritePtr{mBuffer.data()};
        size_t len{mBuffer.size()};

        mDevice->renderSamples(WritePtr, static_cast<ALuint>(len)/frameSize, frameStep);
        while(len > 0 && !mKillNow.load(std::memory_order_acquire))
        {
            size_t wrote{sio_write(mSndHandle, WritePtr, len)};
            if(wrote == 0)
            {
                ERR("sio_write failed\n");
                mDevice->handleDisconnect("Failed to write playback samples");
                break;
            }

            len -= wrote;
            WritePtr += wrote;
        }
    }

    return 0;
}